

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O0

void uv__async_stop(uv_loop_t *loop,uv__async *wa)

{
  uv__async *wa_local;
  uv_loop_t *loop_local;
  
  if ((wa->io_watcher).fd != -1) {
    if (wa->wfd != -1) {
      if (wa->wfd != (wa->io_watcher).fd) {
        uv__close(wa->wfd);
      }
      wa->wfd = -1;
    }
    uv__io_stop(loop,&wa->io_watcher,1);
    uv__close((wa->io_watcher).fd);
    (wa->io_watcher).fd = -1;
  }
  return;
}

Assistant:

void uv__async_stop(uv_loop_t* loop) {
  if (loop->async_io_watcher.fd == -1)
    return;

  if (loop->async_wfd != -1) {
    if (loop->async_wfd != loop->async_io_watcher.fd)
      uv__close(loop->async_wfd);
    loop->async_wfd = -1;
  }

  uv__io_stop(loop, &loop->async_io_watcher, POLLIN);
  uv__close(loop->async_io_watcher.fd);
  loop->async_io_watcher.fd = -1;
}